

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimeter)

{
  size_t sVar1;
  long *plVar2;
  int iVar3;
  long *plVar4;
  bool bVar5;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  string *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_58 = delimeter;
  while( true ) {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,">","");
    plVar4 = local_78;
    sVar1 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar1 == local_70) &&
       ((sVar1 == 0 ||
        (iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_78,sVar1), iVar3 == 0)
        ))) {
      bVar5 = false;
    }
    else {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"}","");
      plVar2 = local_50;
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar1 == local_48) {
        if (sVar1 == 0) {
          bVar5 = false;
        }
        else {
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar1);
          bVar5 = iVar3 != 0;
        }
      }
      else {
        bVar5 = true;
      }
      plVar4 = local_78;
      if (plVar2 != local_40) {
        operator_delete(plVar2,local_40[0] + 1);
        plVar4 = local_78;
      }
    }
    if (plVar4 != local_68) {
      operator_delete(plVar4,local_68[0] + 1);
    }
    if (!bVar5) break;
    bVar5 = ConsumeField(this,message);
    if (!bVar5) {
      return false;
    }
  }
  bVar5 = Consume(this,local_58);
  return bVar5;
}

Assistant:

bool ConsumeMessage(Message* message, const string delimeter) {
    while (!LookingAt(">") &&  !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimeter.
    DO(Consume(delimeter));

    return true;
  }